

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
Server::start(Server *this,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *modules)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  pointer pbVar3;
  string local_48;
  
  do_socket(this);
  do_bind(this);
  listen(this->server_sock,5);
  do_epoll(this);
  do_timer(this);
  pbVar3 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    unaff_R12 = &local_48.field_2;
    do {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)unaff_R12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + pbVar3->_M_string_length);
      load_module(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  do_udp(this);
  printf("Listen %s:%u\n",(this->server_addr)._M_dataplus._M_p,(ulong)this->port_no);
  event_loop(this,0x400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Server::start(std::vector<std::string> modules) {
    this->do_socket();
    this->do_bind();
    this->do_listen();
    this->do_epoll();
    this->do_timer();
    for (auto &&module : modules) {
        this->load_module(module);
    }
    this->do_udp();
    printf("Listen %s:%u\n", this->server_addr.c_str(), this->port_no);
    this->event_loop(1024);
}